

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_dist.hpp
# Opt level: O2

result_type_conflict3 * __thiscall
trng::uniform_dist<long_double>::icdf
          (result_type_conflict3 *__return_storage_ptr__,uniform_dist<long_double> *this,
          result_type_conflict3 x)

{
  result_type_conflict3 *in_RAX;
  int *piVar1;
  
  if (x._0_10_ < (longdouble)0 || (longdouble)1 < x._0_10_) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    return in_RAX;
  }
  return in_RAX;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return x * P.d() + P.a();
    }